

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slufactor_rational.hpp
# Opt level: O3

string * __thiscall
soplex::SLUFactorRational::statistics_abi_cxx11_
          (string *__return_storage_ptr__,SLUFactorRational *this)

{
  long lVar1;
  int iVar2;
  long *plVar3;
  ostream *poVar4;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  stringstream s;
  stringstream local_1a0 [16];
  long local_190 [2];
  undefined8 auStack_180 [12];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"Factorizations     : ",0x15);
  *(undefined8 *)((long)auStack_180 + *(long *)(local_190[0] + -0x18)) = 10;
  iVar2 = (*(this->super_SLinSolverRational)._vptr_SLinSolverRational[10])(this);
  plVar3 = (long *)std::ostream::operator<<((ostream *)local_190,iVar2);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  poVar4 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  Time spent       : ",0x15);
  lVar1 = *(long *)poVar4;
  *(undefined8 *)(poVar4 + *(long *)(lVar1 + -0x18) + 0x10) = 10;
  *(uint *)(poVar4 + *(long *)(lVar1 + -0x18) + 0x18) =
       *(uint *)(poVar4 + *(long *)(lVar1 + -0x18) + 0x18) & 0xfffffefb | 4;
  *(undefined8 *)(poVar4 + *(long *)(lVar1 + -0x18) + 8) = 2;
  (*((this->super_CLUFactorRational).factorTime)->_vptr_Timer[6])();
  poVar4 = std::ostream::_M_insert<double>(extraout_XMM0_Qa);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  poVar4 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Solves             : ",0x15);
  *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 10;
  plVar3 = (long *)std::ostream::operator<<((ostream *)poVar4,this->solveCount);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  poVar4 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  Time spent       : ",0x15);
  *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 10;
  (*this->solveTime->_vptr_Timer[6])();
  poVar4 = std::ostream::_M_insert<double>(extraout_XMM0_Qa_00);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

inline std::string SLUFactorRational::statistics() const
{
   std::stringstream s;
   s  << "Factorizations     : " << std::setw(10) << getFactorCount() << std::endl
      << "  Time spent       : " << std::setw(10) << std::fixed << std::setprecision(
         2) << getFactorTime() << std::endl
      << "Solves             : " << std::setw(10) << getSolveCount() << std::endl
      << "  Time spent       : " << std::setw(10) << getSolveTime() << std::endl;

   return s.str();
}